

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O0

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::DumpByteCode
          (JsBuiltInEngineInterfaceExtensionObject *this,JsBuiltInFile_conflict file)

{
  code *pcVar1;
  bool bVar2;
  FunctionBody **ppFVar3;
  undefined4 *puVar4;
  JsBuiltInFile_conflict file_local;
  JsBuiltInEngineInterfaceExtensionObject *this_local;
  
  Output::Print(L"Dumping JS Built Ins Byte Code:\n");
  if (file == Array_prototype) {
    ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInArray_prototypeBytecode);
    if (*ppFVar3 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                  ,0xdb,"(this->jsBuiltInArray_prototypeBytecode != nullptr)",
                                  "this->jsBuiltInArray_prototypeBytecode != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInArray_prototypeBytecode);
    ByteCodeDumper::DumpRecursively(*ppFVar3);
  }
  else if (file == Math_object) {
    ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInMath_objectBytecode);
    if (*ppFVar3 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                  ,0xdb,"(this->jsBuiltInMath_objectBytecode != nullptr)",
                                  "this->jsBuiltInMath_objectBytecode != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInMath_objectBytecode);
    ByteCodeDumper::DumpRecursively(*ppFVar3);
  }
  else if (file == Object_constructor) {
    ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInObject_constructorBytecode);
    if (*ppFVar3 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                  ,0xdb,"(this->jsBuiltInObject_constructorBytecode != nullptr)",
                                  "this->jsBuiltInObject_constructorBytecode != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ppFVar3 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__
                        ((WriteBarrierPtr *)&this->jsBuiltInObject_constructorBytecode);
    ByteCodeDumper::DumpRecursively(*ppFVar3);
  }
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::DumpByteCode(JsBuiltInFile file)
    {
        Output::Print(_u("Dumping JS Built Ins Byte Code:\n"));
        switch (file)
        {
            #define fileCase(class, type, obj) \
            case class##_##type: \
                Assert(this->jsBuiltIn##class##_##type##Bytecode != nullptr); \
                Js::ByteCodeDumper::DumpRecursively(this->jsBuiltIn##class##_##type##Bytecode); \
                break;
            JsBuiltIns(fileCase)
            #undef fileCase
        }
    }